

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  
  this->document_ = (ostream *)CONCAT44(in_register_00000034,__fd);
  this->addChildValues_ = false;
  std::__cxx11::string::assign((char *)&this->indentString_);
  writeCommentBeforeValue(this,(Value *)__buf);
  writeValue(this,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this,(Value *)__buf);
  poVar1 = std::operator<<(this->document_,"\n");
  this->document_ = (ostream *)0x0;
  return (ssize_t)poVar1;
}

Assistant:

void StyledStreamWriter::write(std::ostream& out, const Value& root) {
  document_ = &out;
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *document_ << "\n";
  document_ = NULL; // Forget the stream, for safety.
}